

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void int_linear_dom(vec<int> *a,vec<IntVar_*> *x,int c)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  IntVar **ppIVar5;
  IntVar *pIVar6;
  uint i;
  ulong uVar7;
  vec<vec<int>_> t;
  int local_50;
  int local_4c;
  vec<vec<int>_> local_48;
  int local_34;
  
  for (uVar7 = 0; uVar7 < x->sz; uVar7 = uVar7 + 1) {
    IntVar::specialiseToEL(x->data[uVar7]);
  }
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (vec<int> *)0x0;
  pIVar6 = *x->data;
  for (local_4c = (pIVar6->min).v; local_4c <= (pIVar6->max).v; local_4c = local_4c + 1) {
    bVar2 = IntVar::indomain(pIVar6,(long)local_4c);
    ppIVar5 = x->data;
    if (bVar2) {
      pIVar6 = ppIVar5[1];
      for (local_50 = (pIVar6->min).v; local_50 <= (pIVar6->max).v; local_50 = local_50 + 1) {
        bVar2 = IntVar::indomain(pIVar6,(long)local_50);
        if (bVar2) {
          piVar1 = a->data;
          iVar3 = local_50 * piVar1[1] + (c - local_4c * *piVar1);
          iVar4 = iVar3 / piVar1[2];
          if ((iVar3 % piVar1[2] == 0) &&
             (local_34 = iVar4, bVar2 = IntVar::indomain(x->data[2],(long)iVar4), bVar2)) {
            vec<vec<int>_>::push(&local_48);
            vec<int>::push(local_48.data + (local_48.sz - 1),&local_4c);
            vec<int>::push(local_48.data + (local_48.sz - 1),&local_50);
            vec<int>::push(local_48.data + (local_48.sz - 1),&local_34);
          }
        }
        ppIVar5 = x->data;
        pIVar6 = ppIVar5[1];
      }
    }
    pIVar6 = *ppIVar5;
  }
  table_GAC(x,&local_48);
  vec<vec<int>_>::~vec(&local_48);
  return;
}

Assistant:

void int_linear_dom(vec<int>& a, vec<IntVar*>& x, int c) {
	assert(a.size() == 3 && x.size() == 3);

	for (unsigned int i = 0; i < x.size(); i++) {
		x[i]->specialiseToEL();
	}

	vec<vec<int> > t;
	for (int i = x[0]->getMin(); i <= x[0]->getMax(); i++) {
		if (!x[0]->indomain(i)) {
			continue;
		}
		for (int j = x[1]->getMin(); j <= x[1]->getMax(); j++) {
			if (!x[1]->indomain(j)) {
				continue;
			}
			int k = c - a[0] * i + a[1] * j;
			if (k % a[2] != 0) {
				continue;
			}
			k /= a[2];
			if (!x[2]->indomain(k)) {
				continue;
			}
			t.push();
			t.last().push(i);
			t.last().push(j);
			t.last().push(k);
		}
	}

	table_GAC(x, t);
}